

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uv-common.c
# Opt level: O1

int uv_ip6_addr(char *ip,int port,sockaddr_in6 *addr)

{
  uint uVar1;
  int iVar2;
  char *pcVar3;
  size_t __n;
  char address_part [40];
  char acStack_58 [48];
  
  addr->sin6_family = 0;
  addr->sin6_port = 0;
  addr->sin6_flowinfo = 0;
  *(undefined8 *)&(addr->sin6_addr).__in6_u = 0;
  *(undefined8 *)((long)&(addr->sin6_addr).__in6_u + 4) = 0;
  *(undefined8 *)((long)&(addr->sin6_addr).__in6_u + 0xc) = 0;
  addr->sin6_family = 10;
  addr->sin6_port = (ushort)port << 8 | (ushort)port >> 8;
  pcVar3 = strchr(ip,0x25);
  if (pcVar3 != (char *)0x0) {
    __n = 0x27;
    if ((ulong)((long)pcVar3 - (long)ip) < 0x27) {
      __n = (long)pcVar3 - (long)ip;
    }
    memcpy(acStack_58,ip,__n);
    acStack_58[__n] = '\0';
    uVar1 = if_nametoindex(pcVar3 + 1);
    addr->sin6_scope_id = uVar1;
    ip = acStack_58;
  }
  iVar2 = uv_inet_pton(10,ip,&addr->sin6_addr);
  return iVar2;
}

Assistant:

int uv_ip6_addr(const char* ip, int port, struct sockaddr_in6* addr) {
  char address_part[40];
  size_t address_part_size;
  const char* zone_index;

  memset(addr, 0, sizeof(*addr));
  addr->sin6_family = AF_INET6;
  addr->sin6_port = htons(port);
#ifdef SIN6_LEN
  addr->sin6_len = sizeof(*addr);
#endif

  zone_index = strchr(ip, '%');
  if (zone_index != NULL) {
    address_part_size = zone_index - ip;
    if (address_part_size >= sizeof(address_part))
      address_part_size = sizeof(address_part) - 1;

    memcpy(address_part, ip, address_part_size);
    address_part[address_part_size] = '\0';
    ip = address_part;

    zone_index++; /* skip '%' */
    /* NOTE: unknown interface (id=0) is silently ignored */
#ifdef _WIN32
    addr->sin6_scope_id = atoi(zone_index);
#else
    addr->sin6_scope_id = if_nametoindex(zone_index);
#endif
  }

  return uv_inet_pton(AF_INET6, ip, &addr->sin6_addr);
}